

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  undefined8 uVar12;
  long *plVar13;
  long lVar14;
  size_t sVar15;
  undefined8 uVar16;
  char *pcVar17;
  xmlTextReader *reader;
  uint uVar18;
  char *pcVar19;
  int k;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  size_t sStack_120;
  uint local_10c;
  uint local_f8;
  uint local_f4;
  uint local_c8;
  uint local_c0;
  char *local_b8;
  int iStack_b0;
  char acStack_ac [52];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  char dtdContent [35];
  
  lVar8 = xmlNewDocNode(0,0,"c","");
  bVar27 = *(long *)(lVar8 + 0x18) != 0;
  if (bVar27) {
    fwrite("empty node has children\n",0x18,1,_stderr);
  }
  xmlFreeNode(lVar8);
  xmlResetLastError();
  lVar8 = xmlReadDoc("<?xml version=\"1.0\" standalone=\"yes\"?>\n<doc></doc>\n",0,"UTF-8",0);
  if (lVar8 == 0) {
    fwrite("xmlReadDoc failed\n",0x12,1,_stderr);
  }
  xmlFreeDoc(lVar8);
  xmlResetLastError();
  lVar9 = xmlReadDoc("<doc/>",0,"#unsupported",0x40);
  if (lVar9 == 0) {
    fwrite("xmlReadDoc failed with unsupported encoding\n",0x2c,1,_stderr);
  }
  uVar25 = (ulong)(lVar9 == 0);
  local_60 = (ulong)(lVar8 == 0);
  xmlFreeDoc(lVar9);
  lVar8 = xmlGetLastError();
  if ((((lVar8 == 0) || (*(int *)(lVar8 + 4) != 0x20)) || (*(int *)(lVar8 + 0x10) != 1)) ||
     (iVar3 = strcmp(*(char **)(lVar8 + 8),"Unsupported encoding: #unsupported\n"), iVar3 != 0)) {
    fwrite("xmlReadDoc failed to raise correct error\n",0x29,1,_stderr);
    uVar25 = 1;
  }
  local_c0 = 0;
  lVar8 = xmlReadDoc("<doc/>",0,0,0);
  uVar12 = *(undefined8 *)(lVar8 + 0x18);
  uVar10 = xmlNewReference(lVar8,"lt");
  xmlAddChild(uVar12,uVar10);
  pcVar11 = (char *)xmlNodeGetContent(lVar8);
  if ((*pcVar11 != '<') || (pcVar11[1] != '\0')) {
    fwrite("xmlNodeGetContent failed\n",0x19,1,_stderr);
    local_c0 = 1;
  }
  (*_xmlFree)(pcVar11);
  xmlFreeDoc(lVar8);
  xmlRegisterInputCallbacks(xmlFileMatch,xmlFileOpen,xmlFileRead,xmlFileClose);
  bVar28 = false;
  lVar8 = xmlReadFile("test/ent1",0,0);
  local_f8 = 1;
  if (lVar8 != 0) {
    lVar9 = xmlDocGetRootElement(lVar8);
    if ((lVar9 == 0) || (iVar3 = xmlStrEqual(*(undefined8 *)(lVar9 + 0x10),"EXAMPLE"), iVar3 == 0))
    {
      bVar28 = false;
    }
    else {
      local_f8 = 0;
      bVar28 = true;
    }
  }
  local_68 = uVar25;
  xmlFreeDoc(lVar8);
  xmlPopInputCallbacks();
  if (!bVar28) {
    fwrite("xmlReadFile failed with FILE input callbacks\n",0x2d,1,_stderr);
  }
  builtin_strncpy(dtdContent,"<!ENTITY test \'<elem1/><elem2/>\'>\n",0x23);
  builtin_strncpy(acStack_ac,"c SYSTEM \'entities.dtd\'>\n<doc>&test;</doc>\n",0x2c);
  local_b8 = (char *)0x505954434f44213c;
  iStack_b0._0_1_ = 'E';
  iStack_b0._1_1_ = ' ';
  iStack_b0._2_1_ = 'd';
  iStack_b0._3_1_ = 'o';
  uVar12 = xmlParserInputBufferCreateStatic(dtdContent,0x22,0);
  lVar8 = xmlIOParseDTD(0,uVar12,0);
  plVar13 = (long *)xmlNewParserCtxt();
  plVar13[0x35] = lVar8;
  *(code **)(*plVar13 + 0xd0) = testSwitchDtdExtSubset;
  lVar9 = xmlCtxtReadMemory(plVar13,&local_b8,0x37,0,0,6);
  xmlFreeParserCtxt(plVar13);
  lVar14 = xmlGetDocEntity(lVar9,"test");
  bVar28 = *(long *)(*(long *)(lVar14 + 0x18) + 0x40) != 0;
  if (bVar28) {
    fwrite("Entity content should have NULL doc\n",0x24,1,_stderr);
  }
  *(undefined8 *)(lVar9 + 0x58) = 0;
  xmlFreeDoc(lVar9);
  xmlFreeDtd(lVar8);
  lVar8 = xmlReadDoc("<doc xmlns:a=\'a\'><elem xmlns:b=\'b\'/></doc>",0,0);
  uVar12 = *(undefined8 *)(*(long *)(lVar8 + 0x18) + 0x18);
  lVar9 = xmlNewParserCtxt();
  local_f4 = 0;
  for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
    pcVar11 = (&testCtxtParseContent_tests)[lVar14];
    for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
      if (iVar3 == 0) {
        uVar10 = xmlNewInputFromString(0,pcVar11,2);
        local_b8 = (char *)xmlCtxtParseContent(lVar9,uVar10,uVar12,0);
      }
      else {
        sVar15 = strlen(pcVar11);
        xmlParseInNodeContext(uVar12,pcVar11,sVar15 & 0xffffffff,0,&local_b8);
      }
      pcVar17 = local_b8;
      uVar10 = xmlBufferCreate();
      uVar16 = xmlSaveToBuffer(uVar10,"UTF-8",0);
      for (; pcVar17 != (char *)0x0; pcVar17 = *(char **)(pcVar17 + 0x30)) {
        xmlSaveTree(uVar16,pcVar17);
      }
      xmlSaveClose(uVar16);
      pcVar17 = (char *)xmlBufferDetach(uVar10);
      xmlBufferFree(uVar10);
      if (((iVar3 == 0) && (*(int *)(lVar9 + 0x230) == 0)) ||
         (iVar4 = strcmp(pcVar17,pcVar11), iVar4 != 0)) {
        pcVar19 = "xmlParseInNodeContext";
        if (iVar3 == 0) {
          pcVar19 = "xmlCtxtParseContent";
        }
        fprintf(_stderr,"%s failed test %d, got:\n%s\n",pcVar19,lVar14,pcVar17);
        local_f4 = 1;
      }
      (*_xmlFree)(pcVar17);
      xmlFreeNodeList();
    }
  }
  xmlFreeParserCtxt(lVar9);
  xmlFreeDoc(lVar8);
  iVar3 = xmlParseBalancedChunkMemory
                    (0,0,0,0,"start <node xml:lang=\'en\'>abc</node> end",&local_b8);
  if (((iVar3 == 0) && (local_b8 != (char *)0x0)) &&
     ((lVar8 = *(long *)(local_b8 + 0x30), lVar8 != 0 &&
      ((*(int *)(lVar8 + 8) == 1 && (*(long *)(lVar8 + 0x60) != 0)))))) {
    iVar3 = xmlStrEqual(*(undefined8 *)(*(long *)(lVar8 + 0x60) + 0x10),
                        "http://www.w3.org/XML/1998/namespace");
    uVar18 = 0;
    if (iVar3 == 0) goto LAB_00102a9c;
  }
  else {
LAB_00102a9c:
    fwrite("xmlParseBalancedChunkMemory failed\n",0x23,1,_stderr);
    uVar18 = 1;
  }
  xmlFreeNodeList(local_b8);
  lVar8 = xmlCreatePushParserCtxt(0,0,0,0,0);
  xmlParseChunk(lVar8,"<doc>",5,0);
  iVar3 = 1000000;
  while (bVar26 = iVar3 != 0, iVar3 = iVar3 + -1, bVar26) {
    xmlParseChunk(lVar8,"<elem>text</elem>",0x11,0);
  }
  xmlParseChunk(lVar8,"</doc>",6,1);
  iVar3 = *(int *)(lVar8 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar8 + 0x10));
  xmlFreeParserCtxt(lVar8);
  uVar12 = xmlBufferCreate();
  xmlBufferCat(uVar12,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar12,"<doc><!-- ");
  iVar4 = 2000;
  while (bVar26 = iVar4 != 0, iVar4 = iVar4 + -1, bVar26) {
    xmlBufferCat(uVar12,"0123456789");
  }
  xmlBufferCat(uVar12," --></doc>");
  uVar10 = xmlBufferDetach(uVar12);
  xmlBufferFree(uVar12);
  lVar8 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar5 = xmlStrlen(uVar10);
  xmlParseChunk(lVar8,uVar10,uVar5,0);
  xmlParseChunk(lVar8,0,0,1);
  xmlFreeDoc(*(undefined8 *)(lVar8 + 0x10));
  xmlFreeParserCtxt(lVar8);
  (*_xmlFree)(uVar10);
  uVar12 = xmlBufferCreate();
  xmlBufferCat(uVar12,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCat(uVar12,"<doc>");
  iVar4 = 2000;
  while (bVar26 = iVar4 != 0, iVar4 = iVar4 + -1, bVar26) {
    xmlBufferCat(uVar12,"0123456789");
  }
  xmlBufferCat(uVar12,"</doc>");
  uVar10 = xmlBufferDetach(uVar12);
  xmlBufferFree(uVar12);
  lVar8 = xmlCreatePushParserCtxt(0,0,0,0,0);
  uVar5 = xmlStrlen(uVar10);
  xmlParseChunk(lVar8,uVar10,uVar5,1);
  iVar4 = *(int *)(lVar8 + 0x18);
  xmlFreeDoc(*(undefined8 *)(lVar8 + 0x10));
  xmlFreeParserCtxt(lVar8);
  (*_xmlFree)(uVar10);
  uVar1 = 0;
  for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
    lVar8 = xmlCreatePushParserCtxt(0,0,0,0);
    xmlCtxtSetOptions(lVar8,0x20);
    uVar12 = xmlBufferCreate();
    xmlBufferCCat(uVar12,"<doc>");
    pcVar11 = anon_var_dwarf_301;
    if (iVar20 == 0) {
      pcVar11 = "x";
    }
    xmlBufferCCat(uVar12,pcVar11);
    iVar22 = 2000;
    while (bVar26 = iVar22 != 0, iVar22 = iVar22 + -1, bVar26) {
      xmlBufferCCat(uVar12,"x");
    }
    xmlBufferCCat(uVar12,"]");
    uVar10 = xmlBufferDetach(uVar12);
    xmlBufferFree(uVar12);
    uVar5 = xmlStrlen(uVar10);
    xmlParseChunk(lVar8,uVar10,uVar5,0);
    xmlParseChunk(lVar8,"]>xxx</doc>",0xb);
    if (*(int *)(lVar8 + 0x88) != 0x3e) {
      fprintf(_stderr,"xmlParseChunk failed to detect CData end: %d\n");
      uVar1 = 1;
    }
    (*_xmlFree)(uVar10);
    xmlFreeDoc(*(undefined8 *)(lVar8 + 0x10));
    xmlFreeParserCtxt();
  }
  lVar8 = htmlReadDoc("<html><body><div id=\'myId\'>Hello, World!</div></body></html>",0,0,0);
  if (lVar8 == 0) {
    pcVar11 = "could not parse HTML content\n";
    sStack_120 = 0x1d;
LAB_0010361c:
    fwrite(pcVar11,sStack_120,1,_stderr);
    local_10c = 1;
  }
  else {
    lVar9 = xmlGetID(lVar8,"myId");
    if (lVar9 == 0) {
      pcVar11 = "xmlGetID doesn\'t work on HTML\n";
      sStack_120 = 0x1e;
      goto LAB_0010361c;
    }
    xmlFreeDoc(lVar8);
    local_10c = 0;
  }
  lVar9 = htmlCreatePushParserCtxt(0,0,0,0,0,1);
  htmlParseChunk(lVar9,anon_var_dwarf_389,4,1);
  lVar8 = *(long *)(lVar9 + 0x10);
  iVar20 = xmlStrEqual(*(undefined8 *)(lVar8 + 0x70),"UTF-8");
  if (iVar20 == 0) {
    fwrite("testHtmlPushWithEncoding failed\n",0x20,1,_stderr);
  }
  sStack_120 = (size_t)(iVar20 == 0);
  lVar14 = xmlDocGetRootElement(lVar8);
  iVar20 = xmlStrEqual(*(undefined8 *)
                        (*(long *)(*(long *)(*(long *)(lVar14 + 0x18) + 0x18) + 0x18) + 0x50),
                       anon_var_dwarf_389);
  if (iVar20 == 0) {
    fwrite("testHtmlPushWithEncoding failed\n",0x20,1,_stderr);
    sStack_120 = 1;
  }
  xmlFreeDoc(lVar8);
  htmlFreeParserCtxt(lVar9);
  uVar12 = xmlBufferCreate();
  xmlBufferCCat(uVar12,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>\n");
  xmlBufferCCat(uVar12,"<doc>");
  iVar20 = 0x2000;
  while (bVar26 = iVar20 != 0, iVar20 = iVar20 + -1, bVar26) {
    xmlBufferCCat(uVar12,"x");
  }
  local_70 = sStack_120;
  xmlBufferCCat(uVar12,"</doc>");
  uVar10 = xmlBufferDetach(uVar12);
  xmlBufferFree(uVar12);
  uVar12 = xmlReaderForDoc(uVar10,0,0,0);
  xmlTextReaderRead(uVar12);
  uVar16 = xmlTextReaderConstEncoding(uVar12);
  iVar20 = xmlStrEqual(uVar16,"ISO-8859-1");
  if (iVar20 == 0) {
    fwrite("testReaderEncoding failed\n",0x1a,1,_stderr);
  }
  xmlFreeTextReader(uVar12);
  (*_xmlFree)(uVar10);
  uVar12 = xmlReaderForDoc("<d>x<e>y</e><f>z</f></d>",0,0,0);
  xmlTextReaderRead(uVar12);
  uVar10 = xmlTextReaderReadOuterXml(uVar12);
  iVar22 = xmlStrEqual(uVar10,"<d>x<e>y</e><f>z</f></d>");
  if (iVar22 == 0) {
    fwrite("xmlTextReaderReadOuterXml failed\n",0x21,1,_stderr);
  }
  sStack_120 = (size_t)(iVar22 == 0);
  (*_xmlFree)(uVar10);
  uVar10 = xmlTextReaderReadInnerXml(uVar12);
  iVar22 = xmlStrEqual(uVar10,"x<e>y</e><f>z</f>");
  if (iVar22 == 0) {
    fwrite("xmlTextReaderReadInnerXml failed\n",0x21,1,_stderr);
    sStack_120 = 1;
  }
  (*_xmlFree)(uVar10);
  uVar10 = xmlTextReaderReadString(uVar12);
  iVar22 = xmlStrEqual(uVar10,"xyz");
  if (iVar22 == 0) {
    fwrite("xmlTextReaderReadString failed\n",0x1f,1,_stderr);
    sStack_120 = 1;
  }
  (*_xmlFree)(uVar10);
  xmlFreeTextReader(uVar12);
  local_c8 = 0;
  reader = (xmlTextReader *)
           xmlReaderForDoc("<d>\n  x<e a=\'v\'>y</e><f>z</f>\n  <![CDATA[cdata]]>\n  <!-- comment -->\n  <?pi content?>\n  <empty/>\n</d>"
                           ,0,0,0);
  while (iVar22 = xmlTextReaderRead(reader), 0 < iVar22) {
    iVar22 = testReaderNode(reader);
    if (iVar22 != 0) {
      local_c8 = 1;
      break;
    }
    iVar22 = xmlTextReaderMoveToFirstAttribute(reader);
    if (0 < iVar22) {
      do {
        iVar22 = testReaderNode(reader);
        if (iVar22 != 0) {
          local_c8 = 1;
          break;
        }
        iVar22 = xmlTextReaderMoveToNextAttribute(reader);
      } while (0 < iVar22);
      xmlTextReaderMoveToElement(reader);
    }
  }
  xmlFreeTextReader(reader);
  uVar12 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetErrorHandler(uVar12,testReaderError,&local_b8);
  local_b8 = (char *)0x0;
  iStack_b0 = 0;
  do {
    iVar22 = xmlTextReaderRead(uVar12);
    pcVar11 = local_b8;
  } while (0 < iVar22);
  if (local_b8 != (char *)0x0) {
    pcVar17 = strstr(local_b8,"href or xpointer");
    uVar24 = 0;
    if (pcVar17 != (char *)0x0) goto LAB_001030de;
  }
  fwrite("xmlTextReaderSetErrorHandler failed\n",0x24,1,_stderr);
  uVar24 = 1;
  pcVar11 = local_b8;
LAB_001030de:
  (*_xmlFree)(pcVar11);
  xmlFreeTextReader(uVar12);
  uVar12 = xmlReaderForDoc("<doc xmlns:xi=\'http://www.w3.org/2001/XInclude\'>\n  <xi:include/>\n</doc>\n"
                           ,0,0,0x400);
  xmlTextReaderSetStructuredErrorHandler(uVar12,testStructuredReaderError,&local_b8);
  local_b8 = (char *)0x0;
  iStack_b0 = 0;
  do {
    iVar22 = xmlTextReaderRead(uVar12);
    pcVar11 = local_b8;
  } while (0 < iVar22);
  if (((iStack_b0 != 0x643) || (local_b8 == (char *)0x0)) ||
     (pcVar17 = strstr(local_b8,"href or xpointer"), pcVar17 == (char *)0x0)) {
    fwrite("xmlTextReaderSetStructuredErrorHandler failed\n",0x2e,1,_stderr);
    uVar24 = 1;
    pcVar11 = local_b8;
  }
  local_78 = sStack_120;
  (*_xmlFree)(pcVar11);
  xmlFreeTextReader(uVar12);
  uVar12 = xmlOutputBufferCreateIO(testWriterIOWrite,testWriterIOClose,0,0);
  uVar12 = xmlNewTextWriter(uVar12);
  xmlTextWriterStartDocument(uVar12,"1.0","UTF-8",0);
  xmlTextWriterStartElement(uVar12,"elem");
  xmlTextWriterEndElement(uVar12);
  xmlTextWriterEndDocument(uVar12);
  uVar6 = xmlTextWriterClose(uVar12);
  if (uVar6 != 0x5f1) {
    fprintf(_stderr,"xmlTextWriterClose reported wrong error %d\n",(ulong)uVar6);
  }
  xmlFreeTextWriter(uVar12);
  uVar2 = 0;
  for (lVar8 = 0x10; lVar8 != 0x130; lVar8 = lVar8 + 0x18) {
    lVar9 = *(long *)((long)&testCtxtParseContent_tests + lVar8);
    uVar12 = *(undefined8 *)((long)&PTR_anon_var_dwarf_1df_00106c68 + lVar8);
    uVar10 = xmlBuildRelativeURI(lVar9,uVar12);
    lVar14 = *(long *)((long)&testBuildRelativeUri_tests + lVar8);
    if (*(long *)((long)&testBuildRelativeUri_tests + lVar8) == 0) {
      lVar14 = lVar9;
    }
    iVar22 = xmlStrEqual(uVar10,lVar14);
    if (iVar22 == 0) {
      fprintf(_stderr,"xmlBuildRelativeURI failed uri=%s base=%s result=%s expected=%s\n",lVar9,
              uVar12,uVar10,lVar14);
      uVar2 = 1;
    }
    (*_xmlFree)(uVar10);
  }
  uVar12 = xmlNewParserCtxt();
  xmlCtxtSetCharEncConvImpl(uVar12,rot13ConvImpl,0);
  charEncConvImplError = 0;
  uVar10 = xmlCtxtReadDoc(uVar12,"<?kzy irefvba=\'1.0\'?><qbp/>",0,"rot13",0);
  uVar23 = (uint)charEncConvImplError;
  xmlFreeParserCtxt(uVar12);
  lVar8 = xmlDocGetRootElement(uVar10);
  if ((lVar8 == 0) || (iVar22 = strcmp(*(char **)(lVar8 + 0x10),"doc"), iVar22 != 0)) {
    fwrite("testCharEncConvImpl failed\n",0x1b,1,_stderr);
    uVar23 = 1;
  }
  uVar7 = (uint)local_60;
  uVar21 = (uint)local_68;
  xmlFreeDoc(uVar10);
  return uVar1 | uVar2 |
         uVar23 | local_f4 |
         (uint)local_70 | (uint)(iVar20 == 0) | (uint)local_78 | local_c8 | uVar24 |
         (uint)(uVar6 != 0x5f1) |
         local_f8 | bVar28 | uVar18 | uVar21 | local_c0 | uVar7 | bVar27 | (uint)(iVar3 == 0) |
         iVar4 == 0 | local_10c;
}

Assistant:

int
main(void) {
    int err = 0;

    err |= testNewDocNode();
    err |= testStandaloneWithEncoding();
    err |= testUnsupportedEncoding();
    err |= testNodeGetContent();
    err |= testCFileIO();
#ifdef LIBXML_VALID_ENABLED
    err |= testSwitchDtd();
#endif
#ifdef LIBXML_OUTPUT_ENABLED
    err |= testCtxtParseContent();
#endif
#ifdef LIBXML_SAX1_ENABLED
    err |= testBalancedChunk();
#endif
#ifdef LIBXML_PUSH_ENABLED
    err |= testHugePush();
    err |= testHugeEncodedChunk();
    err |= testPushCDataEnd();
#endif
#ifdef LIBXML_HTML_ENABLED
    err |= testHtmlIds();
#ifdef LIBXML_PUSH_ENABLED
    err |= testHtmlPushWithEncoding();
#endif
#endif
#ifdef LIBXML_READER_ENABLED
    err |= testReaderEncoding();
    err |= testReaderContent();
    err |= testReader();
#ifdef LIBXML_XINCLUDE_ENABLED
    err |= testReaderXIncludeError();
#endif
#endif
#ifdef LIBXML_WRITER_ENABLED
    err |= testWriterClose();
#endif
    err |= testBuildRelativeUri();
#if defined(_WIN32) || defined(__CYGWIN__)
    err |= testWindowsUri();
#endif
    err |= testCharEncConvImpl();

    return err;
}